

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CropResizeLayerParams::MergeFrom
          (CropResizeLayerParams *this,CropResizeLayerParams *from)

{
  float fVar1;
  void *pvVar2;
  LogMessage *other;
  SamplingMode *this_00;
  BoxCoordinatesMode *this_01;
  SamplingMode *from_00;
  BoxCoordinatesMode *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x930b);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom(&this->targetsize_,&from->targetsize_);
  if ((from != (CropResizeLayerParams *)&_CropResizeLayerParams_default_instance_) &&
     (from->mode_ != (SamplingMode *)0x0)) {
    this_00 = mutable_mode(this);
    from_00 = from->mode_;
    if (from_00 == (SamplingMode *)0x0) {
      from_00 = (SamplingMode *)&_SamplingMode_default_instance_;
    }
    SamplingMode::MergeFrom(this_00,from_00);
  }
  if ((from != (CropResizeLayerParams *)&_CropResizeLayerParams_default_instance_) &&
     (from->boxindicesmode_ != (BoxCoordinatesMode *)0x0)) {
    this_01 = mutable_boxindicesmode(this);
    from_01 = from->boxindicesmode_;
    if (from_01 == (BoxCoordinatesMode *)0x0) {
      from_01 = (BoxCoordinatesMode *)&_BoxCoordinatesMode_default_instance_;
    }
    BoxCoordinatesMode::MergeFrom(this_01,from_01);
  }
  if (from->normalizedcoordinates_ == true) {
    this->normalizedcoordinates_ = true;
  }
  fVar1 = from->spatialscale_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    this->spatialscale_ = fVar1;
  }
  return;
}

Assistant:

void CropResizeLayerParams::MergeFrom(const CropResizeLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CropResizeLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  targetsize_.MergeFrom(from.targetsize_);
  if (from.has_mode()) {
    mutable_mode()->::CoreML::Specification::SamplingMode::MergeFrom(from.mode());
  }
  if (from.has_boxindicesmode()) {
    mutable_boxindicesmode()->::CoreML::Specification::BoxCoordinatesMode::MergeFrom(from.boxindicesmode());
  }
  if (from.normalizedcoordinates() != 0) {
    set_normalizedcoordinates(from.normalizedcoordinates());
  }
  if (from.spatialscale() != 0) {
    set_spatialscale(from.spatialscale());
  }
}